

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O2

int __thiscall EventDispatcher::removeAgentsByReceiver(EventDispatcher *this,void *recipient)

{
  int iVar1;
  TimerManager *this_00;
  SyncRetEventAgent<int> *this_01;
  ssize_t sVar2;
  void *__buf;
  int in_R8D;
  
  iVar1 = (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[7])();
  if ((char)iVar1 != '\0') {
    this_00 = TimerManager::getInstance();
    TimerManager::removeAgentsByReceiver(this_00,recipient,&this->super_IEventDispatcher);
    EventQueue::RemoveAgentsByReceiver(&this->mQueue,recipient);
    return 0;
  }
  this_01 = (SyncRetEventAgent<int> *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                         ,0x101);
  *(undefined8 *)&this_01->field_0x8 = 0xfffffffb00000000;
  *(undefined ***)this_01 = &PTR_onRefCountZero_00130038;
  *(EventDispatcher **)(this_01 + 1) = this;
  *(code **)&this_01[1].field_0x8 = removeAgentsByReceiver;
  *(undefined8 *)&this_01[1].field_0x10 = 0;
  *(void **)(this_01 + 2) = recipient;
  *(undefined4 *)&this_01->field_0x10 = 1;
  sVar2 = SyncRetEventAgent<int>::send
                    (this_01,(int)this,__buf,(size_t)removeAgentsByReceiver,in_R8D);
  return (int)sVar2;
}

Assistant:

int EventDispatcher::removeAgentsByReceiver(void* recipient)
{
	if (not isThreadCurrent())
	{
		SyncRetEventAgent1<EventDispatcher, int, void*>* e = 
			jh_new SyncRetEventAgent1<EventDispatcher, int, void*>
			(this, &EventDispatcher::removeAgentsByReceiver, recipient);

		// I am a bad person, but it's either this or make all
		// EventAgent's publicly inherit from Event (instead of
		// Protected inheritance), and that's a big ugly change for
		// little benefit.
		((Event*)e)->setPriority(PRIORITY_HIGH);

		return e->send(this);
	}

	TimerManager *timerMan = TimerManager::getInstance();
	timerMan->removeAgentsByReceiver(recipient, this);
	mQueue.RemoveAgentsByReceiver(recipient);
	return 0;
}